

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::
     JsRTVarAndIntegralArgumentsAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)59,2ul,2ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_2UL> *pJVar2;
  TTDVar pvVar3;
  FileReader *reader_00;
  undefined4 extraout_var;
  FileReader *reader_01;
  FileReader *extraout_RDX;
  ulong local_40;
  size_t i_1;
  size_t i;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_2UL> *vAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,2ul>,(TTD::NSLogEvents::EventKind)59>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar3 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
  pJVar2->Result = pvVar3;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  reader_00 = extraout_RDX;
  for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
    reader_00 = (FileReader *)
                NSSnapValues::ParseTTDVar
                          ((NSSnapValues *)(ulong)(i_1 != 0),SUB81(reader,0),reader_00);
    pJVar2->VarArray[i_1] = reader_00;
  }
  for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
    iVar1 = (*reader->_vptr_FileReader[0xd])(reader,(ulong)(local_40 != 0xfffffffffffffffe));
    pJVar2->ScalarArray[local_40] = CONCAT44(extraout_var,iVar1);
  }
  (*reader->_vptr_FileReader[5])();
  return;
}

Assistant:

void JsRTVarAndIntegralArgumentsAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>* vAction = GetInlineEventDataAs<JsRTVarAndIntegralArgumentsAction_InternalUse<vcount, icount>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(size_t i = 0; i < vcount; ++i)
            {
                vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }

            for(size_t i = 0; i < icount; ++i)
            {
                vAction->ScalarArray[i] = reader->ReadNakedInt64(vcount + i != 0);
            }
            reader->ReadSequenceEnd();
        }